

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

int xmlFAComputesDeterminism(xmlRegParserCtxtPtr ctxt)

{
  xmlRegAtomType xVar1;
  xmlRegAtomType xVar2;
  xmlRegStatePtr pxVar3;
  xmlRegAtomPtr pxVar4;
  xmlRegAtomPtr pxVar5;
  xmlChar *str;
  xmlChar *str_00;
  xmlRegRangePtr pxVar6;
  xmlRegRangePtr pxVar7;
  xmlRegAtomType xVar8;
  xmlRegAtomType xVar9;
  byte bVar10;
  byte bVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  xmlChar *pxVar17;
  xmlChar *pxVar18;
  ulong in_RDX;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  long lVar19;
  xmlRegTrans *pxVar20;
  xmlRegTrans *pxVar21;
  int *piVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  xmlRegRangePtr pxVar28;
  xmlRegAtomPtr pxVar29;
  bool bVar30;
  xmlRegTrans *local_40;
  
  iVar12 = ctxt->determinist;
  if (iVar12 == -1) {
    uVar14 = ctxt->flags;
    for (lVar23 = 0; uVar16 = (ulong)ctxt->nbStates, lVar23 < (long)uVar16; lVar23 = lVar23 + 1) {
      pxVar3 = ctxt->states[lVar23];
      if ((pxVar3 != (xmlRegStatePtr)0x0) && (iVar12 = pxVar3->nbTrans, 1 < iVar12)) {
        lVar25 = 0;
        for (lVar26 = 0; lVar26 < iVar12; lVar26 = lVar26 + 1) {
          if ((pxVar3->trans[lVar26].atom != (xmlRegAtomPtr)0x0) &&
             (pxVar20 = pxVar3->trans + lVar26, pxVar20->to != -1)) {
            for (lVar19 = 0; lVar25 != lVar19; lVar19 = lVar19 + 0x18) {
              pxVar21 = pxVar3->trans;
              iVar12 = *(int *)((long)&pxVar21->to + lVar19);
              if (((iVar12 != -1) &&
                  (pxVar4 = *(xmlRegAtomPtr *)((long)&pxVar21->atom + lVar19),
                  pxVar4 != (xmlRegAtomPtr)0x0)) && (pxVar20->to == iVar12)) {
                pxVar5 = pxVar20->atom;
                if (pxVar5 == pxVar4) {
LAB_0019ce14:
                  if ((pxVar20->counter == *(int *)((long)&pxVar21->counter + lVar19)) &&
                     (pxVar20->count == *(int *)((long)&pxVar21->count + lVar19))) {
                    *(undefined4 *)((long)&pxVar21->to + lVar19) = 0xffffffff;
                  }
                }
                else if (pxVar5 != (xmlRegAtomPtr)0x0) {
                  xVar1 = pxVar5->type;
                  in_RDX = (ulong)xVar1;
                  if (xVar1 == pxVar4->type) {
                    if (xVar1 == XML_REGEXP_CHARVAL) {
                      in_RDX = (ulong)(uint)pxVar5->codepoint;
                      bVar30 = pxVar5->codepoint == pxVar4->codepoint;
LAB_0019ce0d:
                      uVar13 = (uint)bVar30;
                    }
                    else {
                      if (xVar1 != XML_REGEXP_STRING) goto LAB_0019ce2e;
                      if ((uVar14 & 1) != 0) {
                        bVar30 = pxVar5->valuep == pxVar4->valuep;
                        goto LAB_0019ce0d;
                      }
                      uVar13 = xmlStrEqual((xmlChar *)pxVar5->valuep,(xmlChar *)pxVar4->valuep);
                      in_RDX = extraout_RDX;
                    }
                    if (uVar13 != 0) goto LAB_0019ce14;
                  }
                }
              }
LAB_0019ce2e:
            }
            iVar12 = pxVar3->nbTrans;
          }
          lVar25 = lVar25 + 0x18;
        }
      }
    }
    iVar12 = 1;
    for (lVar23 = 0; lVar23 < (int)uVar16; lVar23 = lVar23 + 1) {
      pxVar3 = ctxt->states[lVar23];
      if ((pxVar3 != (xmlRegStatePtr)0x0) && (iVar24 = pxVar3->nbTrans, 1 < iVar24)) {
        local_40 = (xmlRegTrans *)0x0;
        for (lVar25 = 0; lVar25 < iVar24; lVar25 = lVar25 + 1) {
          if ((pxVar3->trans[lVar25].atom != (xmlRegAtomPtr)0x0) &&
             (pxVar20 = pxVar3->trans + lVar25, pxVar20->to != -1)) {
            for (lVar26 = 0; lVar26 != lVar25; lVar26 = lVar26 + 1) {
              if (pxVar3->trans[lVar26].to == -1) goto LAB_0019d3fc;
              pxVar21 = pxVar3->trans + lVar26;
              pxVar4 = pxVar21->atom;
              if (pxVar4 == (xmlRegAtomPtr)0x0) {
                if ((long)pxVar20->to != -1) {
                  iVar24 = xmlFARecurseDeterminism
                                     (ctxt,*(xmlRegStatePtr *)
                                            (&((xmlRegAtomPtr)ctxt->states)->no +
                                            (long)pxVar20->to * 2),(int)in_RDX,
                                      (xmlRegAtomPtr)ctxt->states);
                  xmlFAFinishRecurseDeterminism(ctxt,ctxt->states[pxVar20->to]);
                  iVar12 = 1;
                  in_RDX = extraout_RDX_01;
                  piVar22 = &pxVar20->nd;
                  if (iVar24 != 0) goto LAB_0019d3fc;
                  goto LAB_0019d3ed;
                }
              }
              else {
                pxVar5 = pxVar20->atom;
                if (pxVar5 == pxVar4) goto LAB_0019d3e3;
                if (pxVar5 == (xmlRegAtomPtr)0x0) goto LAB_0019d3fc;
                if (pxVar5->type != XML_REGEXP_ANYCHAR) {
                  xVar1 = pxVar4->type;
                  in_RDX = (ulong)xVar1;
                  if (xVar1 == XML_REGEXP_ANYCHAR) goto LAB_0019d3e3;
                  pxVar29 = pxVar5;
                  if (xVar1 < pxVar5->type) {
                    pxVar29 = pxVar4;
                    pxVar4 = pxVar5;
                  }
                  xVar1 = pxVar29->type;
                  xVar2 = pxVar4->type;
                  if (((xVar1 != xVar2) &&
                      (in_RDX = (ulong)(xVar1 - XML_REGEXP_EPSILON), 5 < xVar1 - XML_REGEXP_EPSILON)
                      ) && (in_RDX = (ulong)(xVar2 - XML_REGEXP_EPSILON),
                           5 < xVar2 - XML_REGEXP_EPSILON)) {
                    xVar8 = xVar2;
                    if (xVar1 >= xVar2 && xVar1 != xVar2) {
                      xVar8 = xVar1;
                    }
                    in_RDX = (ulong)xVar8;
                    xVar9 = xVar2;
                    if (xVar1 < xVar2) {
                      xVar9 = xVar1;
                    }
                    switch(xVar9) {
                    case XML_REGEXP_LETTER:
                      bVar30 = xVar8 < XML_REGEXP_MARK;
                      break;
                    case XML_REGEXP_LETTER_UPPERCASE:
                    case XML_REGEXP_LETTER_LOWERCASE:
                    case XML_REGEXP_LETTER_TITLECASE:
                    case XML_REGEXP_LETTER_MODIFIER:
                    case XML_REGEXP_LETTER_OTHERS:
                    case XML_REGEXP_MARK_NONSPACING:
                    case XML_REGEXP_MARK_SPACECOMBINING:
                    case XML_REGEXP_MARK_ENCLOSING:
                    case XML_REGEXP_NUMBER_DECIMAL:
                    case XML_REGEXP_NUMBER_LETTER:
                    case XML_REGEXP_NUMBER_OTHERS:
                    case XML_REGEXP_PUNCT_CONNECTOR:
                    case XML_REGEXP_PUNCT_DASH:
                    case XML_REGEXP_PUNCT_OPEN:
                    case XML_REGEXP_PUNCT_CLOSE:
                    case XML_REGEXP_PUNCT_INITQUOTE:
                    case XML_REGEXP_PUNCT_FINQUOTE:
                    case XML_REGEXP_PUNCT_OTHERS:
                    case XML_REGEXP_SEPAR_SPACE:
                    case XML_REGEXP_SEPAR_LINE:
                    case XML_REGEXP_SEPAR_PARA:
                    case XML_REGEXP_SYMBOL_MATH:
                    case XML_REGEXP_SYMBOL_CURRENCY:
                    case XML_REGEXP_SYMBOL_MODIFIER:
                    case XML_REGEXP_SYMBOL_OTHERS:
                    case XML_REGEXP_OTHER_CONTROL:
                    case XML_REGEXP_OTHER_FORMAT:
                    case XML_REGEXP_OTHER_PRIVATE:
                    case XML_REGEXP_OTHER_NA:
                      goto switchD_0019d07e_caseD_65;
                    case XML_REGEXP_MARK:
                      bVar30 = xVar8 < XML_REGEXP_NUMBER;
                      break;
                    case XML_REGEXP_NUMBER:
                      bVar30 = xVar8 < XML_REGEXP_PUNCT;
                      break;
                    case XML_REGEXP_PUNCT:
                      bVar30 = xVar8 < XML_REGEXP_SEPAR;
                      break;
                    case XML_REGEXP_SEPAR:
                      bVar30 = xVar8 < XML_REGEXP_SYMBOL;
                      break;
                    case XML_REGEXP_SYMBOL:
                      bVar30 = xVar8 < XML_REGEXP_OTHER;
                      break;
                    case XML_REGEXP_OTHER:
                      if (XML_REGEXP_OTHER_NA < xVar8) goto LAB_0019d3fc;
                      goto switchD_0019d432_caseD_8;
                    default:
                      switch(xVar9) {
                      case XML_REGEXP_ANYSPACE:
                        if ((0x1e < xVar8 - XML_REGEXP_LETTER) ||
                           ((0x7c3fffffU >> (xVar8 - XML_REGEXP_LETTER & 0x1f) & 1) == 0)) {
                          bVar30 = xVar8 == XML_REGEXP_NOTSPACE;
LAB_0019d4a8:
                          if (!bVar30) goto switchD_0019d432_caseD_8;
                        }
                        break;
                      default:
                        goto switchD_0019d432_caseD_8;
                      case XML_REGEXP_INITNAME:
                        if ((0x1d < xVar8 - XML_REGEXP_MARK) && (xVar8 != XML_REGEXP_NOTINITNAME))
                        goto switchD_0019d432_caseD_8;
                        break;
                      case XML_REGEXP_NAMECHAR:
                        if ((0x1d < xVar8 - XML_REGEXP_MARK) ||
                           ((0x3fffff0fU >> (xVar8 - XML_REGEXP_MARK & 0x1f) & 1) == 0)) {
                          bVar30 = xVar8 == XML_REGEXP_NOTNAMECHAR;
                          goto LAB_0019d4a8;
                        }
                        break;
                      case XML_REGEXP_DECIMAL:
                        if (((0x23 < xVar8 - XML_REGEXP_LETTER) ||
                            ((0xfffffc3ffU >> ((ulong)(xVar8 - XML_REGEXP_LETTER) & 0x3f) & 1) == 0)
                            ) && (in_RDX = (ulong)(xVar8 - XML_REGEXP_NOTDECIMAL),
                                 1 < xVar8 - XML_REGEXP_NOTDECIMAL)) goto switchD_0019d432_caseD_8;
                        break;
                      case XML_REGEXP_REALCHAR:
                        if ((0x1d < xVar8 - XML_REGEXP_MARK) ||
                           ((0x3fffff0fU >> (xVar8 - XML_REGEXP_MARK & 0x1f) & 1) == 0)) {
                          bVar30 = xVar8 == XML_REGEXP_NOTDECIMAL;
                          goto LAB_0019d4a8;
                        }
                      }
                      goto LAB_0019d3fc;
                    }
                    if (!bVar30) goto LAB_0019d3fc;
                  }
switchD_0019d432_caseD_8:
                  if (xVar1 == XML_REGEXP_CHARVAL) {
                    if (xVar2 == XML_REGEXP_CHARVAL) {
                      uVar14 = (uint)(pxVar29->codepoint == pxVar4->codepoint);
                    }
                    else {
                      uVar14 = xmlRegCheckCharacter(pxVar4,pxVar29->codepoint);
                      if ((int)uVar14 < 0) {
                        uVar14 = 1;
                      }
                    }
                  }
                  else if (xVar1 == XML_REGEXP_RANGES) {
                    uVar14 = 1;
                    if (xVar2 == XML_REGEXP_RANGES) {
                      for (lVar19 = 0; lVar19 < pxVar29->nbRanges; lVar19 = lVar19 + 1) {
                        for (lVar27 = 0; lVar27 < pxVar4->nbRanges; lVar27 = lVar27 + 1) {
                          pxVar6 = pxVar29->ranges[lVar19];
                          xVar1 = pxVar6->type;
                          if ((xVar1 != XML_REGEXP_RANGES) &&
                             ((xVar1 & ~XML_REGEXP_EPSILON) != XML_REGEXP_SUBREG)) {
                            pxVar7 = pxVar4->ranges[lVar27];
                            if (2 < pxVar7->type - XML_REGEXP_RANGES) {
                              pxVar28 = pxVar7;
                              if (pxVar7->type < xVar1) {
                                pxVar28 = pxVar6;
                                pxVar6 = pxVar7;
                              }
                              xVar1 = pxVar6->type;
                              bVar30 = true;
                              if ((xVar1 == XML_REGEXP_ANYCHAR) ||
                                 (xVar2 = pxVar28->type, xVar2 == XML_REGEXP_ANYCHAR))
                              goto LAB_0019d112;
                              if ((xVar1 == XML_REGEXP_EPSILON) || (xVar2 == XML_REGEXP_EPSILON))
                              goto LAB_0019d12b;
                              if (xVar1 == xVar2) {
                                if (xVar1 == XML_REGEXP_CHARVAL) {
                                  if (pxVar6->end < pxVar28->start) {
LAB_0019d15c:
                                    bVar30 = false;
                                  }
                                  else {
                                    bVar30 = pxVar6->start <= pxVar28->end;
                                  }
                                }
                                goto LAB_0019d112;
                              }
                              if (xVar1 != XML_REGEXP_CHARVAL) {
                                if ((xVar1 != XML_REGEXP_BLOCK_NAME) &&
                                   (xVar2 != XML_REGEXP_BLOCK_NAME)) {
                                  if ((99 < xVar1) && (99 < xVar2)) {
                                    if (xVar1 == XML_REGEXP_OTHER) {
                                      bVar30 = xVar2 - XML_REGEXP_OTHER_CONTROL < 3;
                                      goto LAB_0019d112;
                                    }
                                    if (xVar1 == XML_REGEXP_MARK) {
                                      uVar14 = xVar2 - XML_REGEXP_MARK_NONSPACING;
LAB_0019d33d:
                                      bVar30 = uVar14 < 3;
LAB_0019d112:
                                      if (((pxVar28->neg == 0) != (pxVar6->neg == 0)) == bVar30)
                                      goto LAB_0019d12b;
                                    }
                                    else {
                                      if (xVar1 == XML_REGEXP_NUMBER) {
                                        uVar14 = xVar2 - XML_REGEXP_NUMBER_DECIMAL;
                                        goto LAB_0019d33d;
                                      }
                                      if (xVar1 == XML_REGEXP_PUNCT) {
                                        bVar30 = xVar2 - XML_REGEXP_PUNCT_CONNECTOR < 7;
                                        goto LAB_0019d112;
                                      }
                                      if (xVar1 == XML_REGEXP_SEPAR) {
                                        uVar14 = xVar2 - XML_REGEXP_SEPAR_SPACE;
                                        goto LAB_0019d33d;
                                      }
                                      if (xVar1 == XML_REGEXP_SYMBOL) {
                                        bVar30 = xVar2 - XML_REGEXP_SYMBOL_MATH < 4;
                                        goto LAB_0019d112;
                                      }
                                      if (xVar1 == XML_REGEXP_LETTER) {
                                        bVar30 = xVar2 - XML_REGEXP_LETTER_UPPERCASE < 5;
                                        goto LAB_0019d112;
                                      }
                                      if (xVar2 < XML_REGEXP_BLOCK_NAME) goto LAB_0019d15c;
                                    }
LAB_0019d3bc:
                                    uVar14 = 1;
                                    goto LAB_0019d3cd;
                                  }
                                  switch(xVar1) {
                                  case XML_REGEXP_ANYSPACE:
                                    if (xVar2 == XML_REGEXP_NOTSPACE) {
LAB_0019d2f2:
                                      bVar30 = false;
                                      goto LAB_0019d112;
                                    }
                                    break;
                                  case XML_REGEXP_INITNAME:
                                    if (xVar2 == XML_REGEXP_NOTINITNAME) goto LAB_0019d2f2;
                                    break;
                                  case XML_REGEXP_NAMECHAR:
                                    if (xVar2 == XML_REGEXP_NOTNAMECHAR) goto LAB_0019d2f2;
                                    break;
                                  case XML_REGEXP_DECIMAL:
                                    if (xVar2 == XML_REGEXP_NOTDECIMAL) goto LAB_0019d2f2;
                                    break;
                                  case XML_REGEXP_REALCHAR:
                                    if (xVar2 == XML_REGEXP_NOTREALCHAR) goto LAB_0019d2f2;
                                  }
                                }
                                uVar14 = 1;
                                goto LAB_0019d3cd;
                              }
                              if (pxVar6->neg == 0) {
                                if (pxVar28->neg == 0) goto LAB_0019d1fa;
LAB_0019d249:
                                bVar11 = 1;
                                bVar10 = 0;
                              }
                              else {
                                if (pxVar28->neg == 0) goto LAB_0019d249;
LAB_0019d1fa:
                                bVar10 = 1;
                                bVar11 = 0;
                              }
                              iVar24 = pxVar6->start;
                              while (iVar24 <= pxVar6->end) {
                                iVar15 = xmlRegCheckCharacterRange
                                                   (pxVar28->type,iVar24,pxVar28->start,pxVar28->end
                                                    ,(int)pxVar28->blockName,(xmlChar *)pxVar3);
                                if (iVar15 < 0) break;
                                if (((bool)(bVar11 & iVar15 == 0)) ||
                                   (iVar24 = iVar24 + 1, (bool)(iVar15 == 1 & bVar10)))
                                goto LAB_0019d3bc;
                              }
                            }
                          }
LAB_0019d12b:
                        }
                      }
                      uVar14 = 0;
                    }
                  }
                  else {
                    if (xVar1 != XML_REGEXP_STRING) goto LAB_0019d3e3;
                    str = (xmlChar *)pxVar29->valuep;
                    str_00 = (xmlChar *)pxVar4->valuep;
                    pxVar17 = xmlStrchr(str,'|');
                    pxVar18 = xmlStrchr(str_00,'|');
                    in_RDX = extraout_RDX_00;
                    if ((pxVar17 != (xmlChar *)0x0) == (pxVar18 == (xmlChar *)0x0)) {
switchD_0019d07e_caseD_65:
                      goto LAB_0019d3fc;
                    }
                    uVar14 = xmlRegStrEqualWildcard(str,str_00);
                  }
LAB_0019d3cd:
                  in_RDX = (ulong)(uVar14 == 0);
                  if (pxVar29->neg == pxVar4->neg) {
                    in_RDX = (ulong)uVar14;
                  }
                  if ((int)in_RDX == 0) goto LAB_0019d3fc;
                }
LAB_0019d3e3:
                pxVar20->nd = 1;
                piVar22 = &pxVar21->nd;
LAB_0019d3ed:
                *piVar22 = 1;
                iVar12 = 0;
                local_40 = pxVar20;
              }
LAB_0019d3fc:
            }
            iVar24 = pxVar3->nbTrans;
          }
        }
        if (local_40 != (xmlRegTrans *)0x0) {
          local_40->nd = 2;
        }
      }
      uVar16 = (ulong)(uint)ctxt->nbStates;
    }
    ctxt->determinist = iVar12;
  }
  return iVar12;
}

Assistant:

static int
xmlFAComputesDeterminism(xmlRegParserCtxtPtr ctxt) {
    int statenr, transnr;
    xmlRegStatePtr state;
    xmlRegTransPtr t1, t2, last;
    int i;
    int ret = 1;
    int deep = 1;

#ifdef DEBUG_REGEXP_GRAPH
    printf("xmlFAComputesDeterminism\n");
    xmlRegPrintCtxt(stdout, ctxt);
#endif
    if (ctxt->determinist != -1)
	return(ctxt->determinist);

    if (ctxt->flags & AM_AUTOMATA_RNG)
        deep = 0;

    /*
     * First cleanup the automata removing cancelled transitions
     */
    for (statenr = 0;statenr < ctxt->nbStates;statenr++) {
	state = ctxt->states[statenr];
	if (state == NULL)
	    continue;
	if (state->nbTrans < 2)
	    continue;
	for (transnr = 0;transnr < state->nbTrans;transnr++) {
	    t1 = &(state->trans[transnr]);
	    /*
	     * Determinism checks in case of counted or all transitions
	     * will have to be handled separately
	     */
	    if (t1->atom == NULL) {
		/* t1->nd = 1; */
		continue;
	    }
	    if (t1->to == -1) /* eliminated */
		continue;
	    for (i = 0;i < transnr;i++) {
		t2 = &(state->trans[i]);
		if (t2->to == -1) /* eliminated */
		    continue;
		if (t2->atom != NULL) {
		    if (t1->to == t2->to) {
                        /*
                         * Here we use deep because we want to keep the
                         * transitions which indicate a conflict
                         */
			if (xmlFAEqualAtoms(t1->atom, t2->atom, deep) &&
                            (t1->counter == t2->counter) &&
                            (t1->count == t2->count))
			    t2->to = -1; /* eliminated */
		    }
		}
	    }
	}
    }

    /*
     * Check for all states that there aren't 2 transitions
     * with the same atom and a different target.
     */
    for (statenr = 0;statenr < ctxt->nbStates;statenr++) {
	state = ctxt->states[statenr];
	if (state == NULL)
	    continue;
	if (state->nbTrans < 2)
	    continue;
	last = NULL;
	for (transnr = 0;transnr < state->nbTrans;transnr++) {
	    t1 = &(state->trans[transnr]);
	    /*
	     * Determinism checks in case of counted or all transitions
	     * will have to be handled separately
	     */
	    if (t1->atom == NULL) {
		continue;
	    }
	    if (t1->to == -1) /* eliminated */
		continue;
	    for (i = 0;i < transnr;i++) {
		t2 = &(state->trans[i]);
		if (t2->to == -1) /* eliminated */
		    continue;
		if (t2->atom != NULL) {
                    /*
                     * But here we don't use deep because we want to
                     * find transitions which indicate a conflict
                     */
		    if (xmlFACompareAtoms(t1->atom, t2->atom, 1)) {
			ret = 0;
			/* mark the transitions as non-deterministic ones */
			t1->nd = 1;
			t2->nd = 1;
			last = t1;
		    }
		} else if (t1->to != -1) {
		    /*
		     * do the closure in case of remaining specific
		     * epsilon transitions like choices or all
		     */
		    ret = xmlFARecurseDeterminism(ctxt, ctxt->states[t1->to],
						   t2->to, t2->atom);
                    xmlFAFinishRecurseDeterminism(ctxt, ctxt->states[t1->to]);
		    /* don't shortcut the computation so all non deterministic
		       transition get marked down
		    if (ret == 0)
			return(0);
		     */
		    if (ret == 0) {
			t1->nd = 1;
			/* t2->nd = 1; */
			last = t1;
		    }
		}
	    }
	    /* don't shortcut the computation so all non deterministic
	       transition get marked down
	    if (ret == 0)
		break; */
	}

	/*
	 * mark specifically the last non-deterministic transition
	 * from a state since there is no need to set-up rollback
	 * from it
	 */
	if (last != NULL) {
	    last->nd = 2;
	}

	/* don't shortcut the computation so all non deterministic
	   transition get marked down
	if (ret == 0)
	    break; */
    }

    ctxt->determinist = ret;
    return(ret);
}